

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

void anon_unknown.dwarf_e6eb::peekExpectedDelimiter(istream *in)

{
  KatException *this;
  char c;
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  
  c = std::istream::peek();
  bVar1 = isDelimiter(c);
  if (bVar1) {
    return;
  }
  this = (KatException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"character not followed by delimiter",&local_39);
  KatException::KatException(this,&local_38);
  __cxa_throw(this,&(anonymous_namespace)::KatException::typeinfo,std::runtime_error::~runtime_error
             );
}

Assistant:

void peekExpectedDelimiter(std::istream &in)
    {
        if (!isDelimiter(in.peek())) // FIXME: peek returns int
        {
            throw KatException("character not followed by delimiter");
        }
    }